

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

bool __thiscall
__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>::operator()
          (_Iter_equals_val<std::__cxx11::string_const> *this,
          RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          __it)

{
  size_t __n;
  int iVar1;
  
  __n = *(size_t *)((long)*__it.it_ + 8);
  if (__n != (*(undefined8 **)this)[1]) {
    return false;
  }
  if (__n != 0) {
    iVar1 = bcmp(**__it.it_,(void *)**(undefined8 **)this,__n);
    return iVar1 == 0;
  }
  return true;
}

Assistant:

reference operator*() const { return *reinterpret_cast<Element*>(*it_); }